

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_statistics.cpp
# Opt level: O1

void __thiscall duckdb::BaseStatistics::Serialize(BaseStatistics *this,Serializer *serializer)

{
  StatisticsType SVar1;
  BaseStatistics *value;
  
  (*serializer->_vptr_Serializer[2])(serializer,100,"has_null");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->has_null);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x65,"has_no_null");
  (*serializer->_vptr_Serializer[0xe])(serializer,(ulong)this->has_no_null);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x66,"distinct_count");
  (*serializer->_vptr_Serializer[0x15])(serializer,this->distinct_count);
  (*serializer->_vptr_Serializer[3])(serializer);
  (*serializer->_vptr_Serializer[2])(serializer,0x67,"type_stats");
  (*serializer->_vptr_Serializer[6])(serializer);
  SVar1 = GetStatsType(&this->type);
  switch(SVar1) {
  case NUMERIC_STATS:
    NumericStats::Serialize(this,serializer);
    break;
  case STRING_STATS:
    StringStats::Serialize(this,serializer);
    break;
  case LIST_STATS:
    value = ListStats::GetChildStats(this);
    goto LAB_005f8ad4;
  case STRUCT_STATS:
    StructStats::Serialize(this,serializer);
    break;
  case ARRAY_STATS:
    value = ArrayStats::GetChildStats(this);
LAB_005f8ad4:
    Serializer::WriteProperty<duckdb::BaseStatistics>(serializer,200,"child_stats",value);
  }
  (*serializer->_vptr_Serializer[7])(serializer);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void BaseStatistics::Serialize(Serializer &serializer) const {
	serializer.WriteProperty(100, "has_null", has_null);
	serializer.WriteProperty(101, "has_no_null", has_no_null);
	serializer.WriteProperty(102, "distinct_count", distinct_count);
	serializer.WriteObject(103, "type_stats", [&](Serializer &serializer) {
		switch (GetStatsType()) {
		case StatisticsType::NUMERIC_STATS:
			NumericStats::Serialize(*this, serializer);
			break;
		case StatisticsType::STRING_STATS:
			StringStats::Serialize(*this, serializer);
			break;
		case StatisticsType::LIST_STATS:
			ListStats::Serialize(*this, serializer);
			break;
		case StatisticsType::STRUCT_STATS:
			StructStats::Serialize(*this, serializer);
			break;
		case StatisticsType::ARRAY_STATS:
			ArrayStats::Serialize(*this, serializer);
			break;
		default:
			break;
		}
	});
}